

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UAFundamentalParameter.cpp
# Opt level: O2

int __thiscall DIS::UAFundamentalParameter::getMarshalledSize(UAFundamentalParameter *this)

{
  return 0x14;
}

Assistant:

int UAFundamentalParameter::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 2;  // _activeEmissionParameterIndex
   marshalSize = marshalSize + 2;  // _scanPattern
   marshalSize = marshalSize + 4;  // _beamCenterAzimuthHorizontal
   marshalSize = marshalSize + 4;  // _azimuthalBeamwidthHorizontal
   marshalSize = marshalSize + 4;  // _beamCenterDepressionElevation
   marshalSize = marshalSize + 4;  // _beamwidthDownElevation
    return marshalSize;
}